

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsPathItem::QGraphicsPathItem(QGraphicsPathItem *this,QGraphicsItem *parent)

{
  QGraphicsPathItemPrivate *this_00;
  QAbstractGraphicsShapeItem *in_RSI;
  QAbstractGraphicsShapeItemPrivate *in_RDI;
  
  this_00 = (QGraphicsPathItemPrivate *)operator_new(0x1b0);
  QGraphicsPathItemPrivate::QGraphicsPathItemPrivate(this_00);
  QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem(in_RSI,in_RDI,(QGraphicsItem *)this_00);
  (in_RDI->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate =
       (_func_int **)&PTR__QGraphicsPathItem_00d32768;
  return;
}

Assistant:

QGraphicsPathItem::QGraphicsPathItem(QGraphicsItem *parent)
    : QAbstractGraphicsShapeItem(*new QGraphicsPathItemPrivate, parent)
{
}